

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O0

Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *
__thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::
_nodeAt(HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
        *this,size_t idx)

{
  NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *pNVar1;
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *pNVar2
  ;
  size_t sVar3;
  ulong in_RSI;
  long in_RDI;
  size_t unaff_retaddr;
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *pNode;
  size_t new_index;
  size_t l;
  size_t in_stack_ffffffffffffffb8;
  SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffd0;
  size_t local_20;
  
  if (in_RSI < *(ulong *)(in_RDI + 8)) {
    local_20 = SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
               ::height((SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                         *)0xa0c2e5);
    while (sVar3 = local_20 - 1, local_20 != 0) {
      pNVar1 = SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
               ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_20 = sVar3;
      if ((pNVar1->pNode !=
           (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
            *)0x0) &&
         (pNVar1 = SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                   ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
         pNVar1->width <= in_RSI + 1)) {
        in_stack_ffffffffffffffc0 =
             (SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
              *)(in_RSI + 1);
        pNVar1 = SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                 ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        pNVar2 = (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                  *)((long)in_stack_ffffffffffffffc0 - pNVar1->width);
        SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
        ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        pNVar2 = Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                 ::at(pNVar2,in_stack_ffffffffffffffd0);
        if (pNVar2 != (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                       *)0x0) {
          return pNVar2;
        }
        in_stack_ffffffffffffffd0 = 0;
      }
    }
  }
  _throw_exceeds_size(unaff_retaddr);
  return (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
          *)0x0;
}

Assistant:

const Node<T, _Compare> *HeadNode<T, _Compare>::_nodeAt(size_t idx) const {
    if (idx < _count) {
        for (size_t l = _nodeRefs.height(); l-- > 0;) {
            if (_nodeRefs[l].pNode && _nodeRefs[l].width <= idx + 1) {
                size_t new_index = idx + 1 - _nodeRefs[l].width;
                const Node<T, _Compare> *pNode = _nodeRefs[l].pNode->at(new_index);
                if (pNode) {
                    return pNode;
                }
            }
        }
    }
    assert(idx >= _count);
    _throw_exceeds_size(_count);
    // Should not get here as _throw_exceeds_size() will always throw.
    return NULL;
}